

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lparser.c
# Opt level: O3

LClosure * luaY_parser(lua_State *L,ZIO *z,Mbuffer *buff,Dyndata *dyd,char *name,int firstchar)

{
  StkId pTVar1;
  Table *x_;
  LClosure *pLVar2;
  Proto *pPVar3;
  TString *source;
  Proto *f;
  BlockCnt bl;
  LexState lexstate;
  expdesc local_110;
  BlockCnt local_f8;
  LexState local_e0;
  FuncState local_70;
  
  pLVar2 = luaF_newLclosure(L,1);
  pTVar1 = L->top;
  (pTVar1->value_).gc = (GCObject *)pLVar2;
  pTVar1->tt_ = 0x46;
  luaD_inctop(L);
  local_e0.h = luaH_new(L);
  pTVar1 = L->top;
  (pTVar1->value_).gc = (GCObject *)local_e0.h;
  pTVar1->tt_ = 0x45;
  luaD_inctop(L);
  pPVar3 = luaF_newproto(L);
  pLVar2->p = pPVar3;
  local_70.f = pPVar3;
  source = luaS_new(L,name);
  pPVar3->source = source;
  (dyd->label).n = 0;
  (dyd->gt).n = 0;
  (dyd->actvar).n = 0;
  local_e0.buff = buff;
  local_e0.dyd = dyd;
  luaX_setinput(L,&local_e0,z,source,firstchar);
  local_70.prev = local_e0.fs;
  local_70.pc = 0;
  local_70.lasttarget = 0;
  local_70.jpc = -1;
  local_70.nk = 0;
  local_70.np = 0;
  local_70.nlocvars = 0;
  local_70.nactvar = '\0';
  local_70.nups = '\0';
  local_70.freereg = '\0';
  local_70.firstlocal = ((local_e0.dyd)->actvar).n;
  pPVar3->source = local_e0.source;
  pPVar3->maxstacksize = '\x02';
  local_70.bl = &local_f8;
  local_f8.isloop = '\0';
  local_f8.nactvar = '\0';
  local_f8.firstlabel = ((local_e0.dyd)->label).n;
  local_f8.firstgoto = ((local_e0.dyd)->gt).n;
  local_f8.upval = '\0';
  local_f8.previous = (BlockCnt *)0x0;
  pPVar3->is_vararg = '\x01';
  local_110.t = -1;
  local_110.f = -1;
  local_110.k = VLOCAL;
  local_110.u.info = 0;
  local_e0.fs = &local_70;
  local_70.ls = &local_e0;
  newupvalue(&local_70,local_e0.envn,&local_110);
  luaX_next(&local_e0);
  statlist(&local_e0);
  if (local_e0.t.token == 0x121) {
    close_func(&local_e0);
    L->top = L->top + -1;
    return pLVar2;
  }
  error_expected(&local_e0,0x121);
}

Assistant:

LClosure *luaY_parser (lua_State *L, ZIO *z, Mbuffer *buff,
                       Dyndata *dyd, const char *name, int firstchar) {
  LexState lexstate;
  FuncState funcstate;
  LClosure *cl = luaF_newLclosure(L, 1);  /* create main closure */
  setclLvalue(L, L->top, cl);  /* anchor it (to avoid being collected) */
  luaD_inctop(L);
  lexstate.h = luaH_new(L);  /* create table for scanner */
  sethvalue(L, L->top, lexstate.h);  /* anchor it */
  luaD_inctop(L);
  funcstate.f = cl->p = luaF_newproto(L);
  funcstate.f->source = luaS_new(L, name);  /* create and anchor TString */
  lua_assert(iswhite(funcstate.f));  /* do not need barrier here */
  lexstate.buff = buff;
  lexstate.dyd = dyd;
  dyd->actvar.n = dyd->gt.n = dyd->label.n = 0;
  luaX_setinput(L, &lexstate, z, funcstate.f->source, firstchar);
  mainfunc(&lexstate, &funcstate);
  lua_assert(!funcstate.prev && funcstate.nups == 1 && !lexstate.fs);
  /* all scopes should be correctly finished */
  lua_assert(dyd->actvar.n == 0 && dyd->gt.n == 0 && dyd->label.n == 0);
  L->top--;  /* remove scanner's table */
  return cl;  /* closure is on the stack, too */
}